

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-name-number-tree.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  string *psVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  QPDFObjectHandle *pQVar6;
  long *plVar7;
  QPDFWriter local_e18 [8];
  QPDFWriter w;
  string local_e08 [32];
  longlong *local_de8;
  T *i_5;
  iterator __end1_4;
  iterator __begin1_4;
  QPDFNumberTreeObjectHelper *__range1_4;
  iterator local_d48;
  string local_d18 [32];
  longlong *local_cf8;
  T *i_4;
  iterator __end1_3;
  iterator __begin1_3;
  QPDFNumberTreeObjectHelper *__range1_3;
  undefined1 local_c80 [4];
  int n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  QPDFObjectHandle local_c20;
  int local_c0c;
  undefined1 local_c08 [4];
  int i_3;
  iterator iter2;
  string local_bd0 [32];
  undefined1 local_bb0 [8];
  QPDFObjectHandle number_tree_oh;
  QPDFNumberTreeObjectHelper number_tree;
  allocator<char> local_b61;
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [39];
  allocator<char> local_af9;
  string local_af8 [32];
  iterator local_ad8;
  allocator<char> local_a89;
  string local_a88 [32];
  string local_a68 [39];
  allocator<char> local_a41;
  string local_a40 [32];
  string local_a20 [39];
  allocator<char> local_9f9;
  string local_9f8 [32];
  iterator local_9d8;
  iterator local_990;
  allocator<char> local_941;
  string local_940 [32];
  iterator local_920;
  string local_8d8 [39];
  allocator<char> local_8b1;
  string local_8b0 [32];
  iterator local_890;
  string local_848 [39];
  allocator<char> local_821;
  string local_820 [39];
  allocator<char> local_7f9;
  string local_7f8 [32];
  undefined1 local_7d8 [8];
  QPDFObjectHandle obj;
  string local_7c0 [39];
  allocator<char> local_799;
  string local_798 [32];
  string local_778 [32];
  undefined8 local_758;
  T *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  QPDFArrayItems *__range1_2;
  T *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  QPDFDictItems *__range1_1;
  QPDFObjectHandle names;
  undefined1 local_608 [8];
  T i;
  iterator __end1;
  iterator __begin1;
  QPDFNameTreeObjectHelper *__range1;
  string local_520 [32];
  string local_500 [39];
  allocator<char> local_4d9;
  string local_4d8 [32];
  QPDFObjectHandle local_4b8;
  allocator<char> local_4a1;
  string local_4a0 [32];
  undefined1 local_480 [8];
  iterator iter;
  string local_430 [32];
  QPDFObjectHandle local_410;
  allocator<char> local_3f9;
  string local_3f8 [32];
  iterator local_3d8;
  allocator<char> local_389;
  string local_388 [32];
  QPDFObjectHandle local_368;
  allocator<char> local_351;
  string local_350 [32];
  iterator local_330;
  allocator<char> local_2e1;
  string local_2e0 [32];
  QPDFObjectHandle local_2c0;
  allocator<char> local_2a9;
  string local_2a8 [32];
  iterator local_288;
  allocator<char> local_239;
  string local_238 [32];
  QPDFObjectHandle local_218;
  allocator<char> local_201;
  string local_200 [32];
  iterator local_1e0;
  allocator<char> local_191;
  string local_190 [32];
  QPDFObjectHandle local_170;
  allocator<char> local_159;
  string local_158 [32];
  iterator local_138;
  allocator<char> local_e9;
  string local_e8 [32];
  undefined1 local_c8 [8];
  QPDFObjectHandle name_tree_oh;
  QPDFNameTreeObjectHelper name_tree;
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  QPDFObjectHandle example;
  QPDFObjectHandle root;
  QPDF local_28 [8];
  QPDF qpdf;
  char *outfilename;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc != 2) {
    usage();
  }
  _qpdf = argv[1];
  QPDF::QPDF(local_28);
  QPDF::emptyPDF();
  QPDF::getRoot();
  QPDFObjectHandle::newDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"/Example",&local_79);
  QPDFObjectHandle::replaceKey
            ((string *)
             &example.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFObjectHandle *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  QPDFNameTreeObjectHelper::newEmpty
            ((QPDF *)&name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             SUB81(local_28,0));
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"/NameTree",&local_e9);
  QPDFObjectHandle::replaceKey((string *)local_58,(QPDFObjectHandle *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"K",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"king",&local_191);
  QPDFObjectHandle::newUnicodeString((string *)&local_170);
  QPDFNameTreeObjectHelper::insert
            ((string *)&local_138,
             (QPDFObjectHandle *)
             &name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_138);
  QPDFObjectHandle::~QPDFObjectHandle(&local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"Q",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"queen",&local_239);
  QPDFObjectHandle::newUnicodeString((string *)&local_218);
  QPDFNameTreeObjectHelper::insert
            ((string *)&local_1e0,
             (QPDFObjectHandle *)
             &name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_1e0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"R",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"rook",&local_2e1);
  QPDFObjectHandle::newUnicodeString((string *)&local_2c0);
  QPDFNameTreeObjectHelper::insert
            ((string *)&local_288,
             (QPDFObjectHandle *)
             &name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_288);
  QPDFObjectHandle::~QPDFObjectHandle(&local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"B",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_388,"bishop",&local_389);
  QPDFObjectHandle::newUnicodeString((string *)&local_368);
  QPDFNameTreeObjectHelper::insert
            ((string *)&local_330,
             (QPDFObjectHandle *)
             &name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_330);
  QPDFObjectHandle::~QPDFObjectHandle(&local_368);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"N",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_430,"knight",
             (allocator<char> *)
             ((long)&iter.ivalue.second.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount + 7));
  QPDFObjectHandle::newUnicodeString((string *)&local_410);
  QPDFNameTreeObjectHelper::insert
            ((string *)&local_3d8,
             (QPDFObjectHandle *)
             &name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_3d8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_410);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iter.ivalue.second.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount + 7));
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"P",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"pawn",&local_4d9);
  QPDFObjectHandle::newUnicodeString((string *)&local_4b8);
  QPDFNameTreeObjectHelper::insert
            ((string *)local_480,
             (QPDFObjectHandle *)
             &name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle(&local_4b8);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  poVar3 = std::operator<<((ostream *)&std::cout,"just inserted ");
  psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," -> ");
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_500);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_500);
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_480);
  poVar3 = std::operator<<((ostream *)&std::cout,"predecessor: ");
  psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," -> ");
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_520);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_520);
  QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_480);
  QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_480);
  poVar3 = std::operator<<((ostream *)&std::cout,"successor: ");
  psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," -> ");
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,(string *)&__range1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&__range1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Name tree items:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while (bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                           ((iterator *)
                            &__end1.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            (iterator *)
                            &i.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        , bVar1) {
    ppVar5 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
              *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)local_608,ppVar5);
    poVar3 = std::operator<<((ostream *)&std::cout,"  ");
    poVar3 = std::operator<<(poVar3,(string *)local_608);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)
                                    &names.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)
               &names.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
             *)local_608);
    QPDFNameTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &i.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = std::operator<<((ostream *)&std::cout,"Keys in name tree object:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range1_1);
  QPDFObjectHandle::ditems();
  QPDFObjectHandle::QPDFDictItems::begin();
  QPDFObjectHandle::QPDFDictItems::end();
  while (bVar1 = QPDFObjectHandle::QPDFDictItems::iterator::operator!=
                           ((iterator *)
                            &__end1_1.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            (iterator *)&i_1), bVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar1 = std::operator==(__lhs,"/Names");
    if (bVar1) {
      QPDFObjectHandle::operator=((QPDFObjectHandle *)&__range1_1,(QPDFObjectHandle *)(__lhs + 1));
    }
    QPDFObjectHandle::QPDFDictItems::iterator::operator++
              ((iterator *)
               &__end1_1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&i_1);
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator
            ((iterator *)
             &__end1_1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::QPDFDictItems::~QPDFDictItems
            ((QPDFDictItems *)
             &__begin1_1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = std::operator<<((ostream *)&std::cout,"Values in names:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::aitems();
  QPDFObjectHandle::QPDFArrayItems::begin();
  QPDFObjectHandle::QPDFArrayItems::end();
  while (bVar1 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                           ((iterator *)
                            &__end1_2.ivalue.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            (iterator *)&i_2), bVar1) {
    local_758 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*
                          ((iterator *)
                           &__end1_2.ivalue.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    poVar3 = std::operator<<((ostream *)&std::cout,"  ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_778);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_778);
    QPDFObjectHandle::QPDFArrayItems::iterator::operator++
              ((iterator *)
               &__end1_2.ivalue.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&i_2);
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator
            ((iterator *)
             &__end1_2.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems
            ((QPDFArrayItems *)
             &__begin1_2.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = std::operator<<((ostream *)&std::cout,"Has Q?: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_798,"Q",&local_799);
  bVar2 = QPDFNameTreeObjectHelper::hasName
                    ((string *)
                     &name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  poVar3 = std::operator<<((ostream *)&std::cout,"Has W?: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7c0,"W",
             (allocator<char> *)
             ((long)&obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  bVar2 = QPDFNameTreeObjectHelper::hasName
                    ((string *)
                     &name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_7d8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Found W?: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"W",&local_7f9);
  bVar2 = QPDFNameTreeObjectHelper::findObject
                    ((string *)
                     &name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (QPDFObjectHandle *)local_7f8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  poVar3 = std::operator<<((ostream *)&std::cout,"Found Q?: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"Q",&local_821);
  bVar2 = QPDFNameTreeObjectHelper::findObject
                    ((string *)
                     &name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (QPDFObjectHandle *)local_820);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator(&local_821);
  poVar3 = std::operator<<((ostream *)&std::cout,"Q: ");
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_848);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8b0,"Q",&local_8b1);
  QPDFNameTreeObjectHelper::find((string *)&local_890,(bool)((char)&name_tree_oh + '\b'));
  QPDFNameTreeObjectHelper::iterator::operator=((iterator *)local_480,&local_890);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_890);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Q: ");
  psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," -> ");
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_8d8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_940,"W",&local_941);
  QPDFNameTreeObjectHelper::find((string *)&local_920,(bool)((char)&name_tree_oh + '\b'));
  QPDFNameTreeObjectHelper::iterator::operator=((iterator *)local_480,&local_920);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_920);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator(&local_941);
  poVar3 = std::operator<<((ostream *)&std::cout,"W found: ");
  QPDFNameTreeObjectHelper::end();
  bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=((iterator *)local_480,&local_990);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9f8,"W",&local_9f9);
  QPDFNameTreeObjectHelper::find((string *)&local_9d8,(bool)((char)&name_tree_oh + '\b'));
  QPDFNameTreeObjectHelper::iterator::operator=((iterator *)local_480,&local_9d8);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_9d8);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  poVar3 = std::operator<<((ostream *)&std::cout,"W\'s predecessor: ");
  psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," -> ");
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_a20);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a20);
  poVar3 = std::operator<<((ostream *)&std::cout,"Remove P: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a40,"P",&local_a41);
  bVar2 = QPDFNameTreeObjectHelper::remove
                    ((string *)
                     &name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (QPDFObjectHandle *)local_a40);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator(&local_a41);
  poVar3 = std::operator<<((ostream *)&std::cout,"Value removed: ");
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_a68);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a68);
  poVar3 = std::operator<<((ostream *)&std::cout,"Has P?: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a88,"P",&local_a89);
  bVar2 = QPDFNameTreeObjectHelper::hasName
                    ((string *)
                     &name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a88);
  std::allocator<char>::~allocator(&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_af8,"K",&local_af9);
  QPDFNameTreeObjectHelper::find((string *)&local_ad8,(bool)((char)&name_tree_oh + '\b'));
  QPDFNameTreeObjectHelper::iterator::operator=((iterator *)local_480,&local_ad8);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_ad8);
  std::__cxx11::string::~string(local_af8);
  std::allocator<char>::~allocator(&local_af9);
  poVar3 = std::operator<<((ostream *)&std::cout,"Find K: ");
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_b20);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_b20);
  QPDFNameTreeObjectHelper::iterator::remove();
  poVar3 = std::operator<<((ostream *)&std::cout,"Iter after removing K: ");
  psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," -> ");
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_b40);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_b40);
  poVar3 = std::operator<<((ostream *)&std::cout,"Has K?: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b60,"K",&local_b61);
  bVar2 = QPDFNameTreeObjectHelper::hasName
                    ((string *)
                     &name_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator(&local_b61);
  QPDFNumberTreeObjectHelper::newEmpty
            ((QPDF *)&number_tree_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             SUB81(local_28,0));
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_bb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bd0,"/NumberTree",
             (allocator<char> *)
             ((long)&iter2.ivalue.second.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount + 7));
  QPDFObjectHandle::replaceKey((string *)local_58,(QPDFObjectHandle *)local_bd0);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iter2.ivalue.second.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount + 7));
  QPDFNumberTreeObjectHelper::begin();
  for (local_c0c = 7; local_c0c < 0x15f; local_c0c = local_c0c + 7) {
    pQVar6 = (QPDFObjectHandle *)(long)local_c0c;
    std::__cxx11::to_string((string *)local_c80,local_c0c);
    std::operator+(&local_c60,"-",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c80);
    std::operator+(&local_c40,&local_c60,"-");
    QPDFObjectHandle::newString((string *)&local_c20);
    QPDFNumberTreeObjectHelper::iterator::insertAfter((longlong)local_c08,pQVar6);
    QPDFObjectHandle::~QPDFObjectHandle(&local_c20);
    std::__cxx11::string::~string((string *)&local_c40);
    std::__cxx11::string::~string((string *)&local_c60);
    std::__cxx11::string::~string((string *)local_c80);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Numbers:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __range1_3._4_4_ = 1;
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::end();
  while (bVar1 = QPDFNumberTreeObjectHelper::iterator::operator!=
                           ((iterator *)
                            &__end1_3.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            (iterator *)&i_4), bVar1) {
    local_cf8 = (longlong *)
                QPDFNumberTreeObjectHelper::iterator::operator*
                          ((iterator *)
                           &__end1_3.ivalue.second.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_cf8);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFObjectHandle::getUTF8Value_abi_cxx11_();
    std::operator<<(poVar3,local_d18);
    std::__cxx11::string::~string(local_d18);
    if (__range1_3._4_4_ % 5 == 0) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::operator<<((ostream *)&std::cout,", ");
    }
    __range1_3._4_4_ = __range1_3._4_4_ + 1;
    QPDFNumberTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1_3.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&i_4);
  QPDFNumberTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1_3.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::iterator::operator=((iterator *)local_c08,&local_d48);
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_d48);
  while( true ) {
    QPDFNumberTreeObjectHelper::end();
    bVar1 = QPDFNumberTreeObjectHelper::iterator::operator!=
                      ((iterator *)local_c08,(iterator *)&__range1_4);
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&__range1_4);
    if (!bVar1) break;
    plVar7 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->((iterator *)local_c08);
    if (*plVar7 % 5 == 0) {
      QPDFNumberTreeObjectHelper::iterator::remove();
    }
    else {
      QPDFNumberTreeObjectHelper::iterator::operator++((iterator *)local_c08);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Numbers after filtering:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __range1_3._4_4_ = 1;
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::end();
  while (bVar1 = QPDFNumberTreeObjectHelper::iterator::operator!=
                           ((iterator *)
                            &__end1_4.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            (iterator *)&i_5), bVar1) {
    local_de8 = (longlong *)
                QPDFNumberTreeObjectHelper::iterator::operator*
                          ((iterator *)
                           &__end1_4.ivalue.second.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_de8);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFObjectHandle::getUTF8Value_abi_cxx11_();
    std::operator<<(poVar3,local_e08);
    std::__cxx11::string::~string(local_e08);
    if (__range1_3._4_4_ % 5 == 0) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::operator<<((ostream *)&std::cout,", ");
    }
    __range1_3._4_4_ = __range1_3._4_4_ + 1;
    QPDFNumberTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1_4.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&i_5);
  QPDFNumberTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1_4.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFWriter::QPDFWriter(local_e18,local_28,_qpdf);
  QPDFWriter::setQDFMode(SUB81(local_e18,0));
  QPDFWriter::setStaticID(SUB81(local_e18,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_e18);
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)local_c08);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_bb0);
  QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper
            ((QPDFNumberTreeObjectHelper *)
             &number_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_7d8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1_1);
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_480);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c8);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper
            ((QPDFNameTreeObjectHelper *)
             &name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &example.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::~QPDF(local_28);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 2) {
        usage();
    }

    char const* outfilename = argv[1];

    QPDF qpdf;
    qpdf.emptyPDF();

    // This example doesn't do anything particularly useful other than just illustrate how to use
    // the APIs for name and number trees. It also demonstrates use of the iterators for
    // dictionaries and arrays introduced at the same time with qpdf 10.2.

    // To use this example, compile it and run it. Study the output and compare it to what you
    // expect. When done, look at the generated output file in a text editor to inspect the
    // structure of the trees as left in the file.

    // We're just going to create some name and number trees, hang them off the document catalog
    // (root), and write an empty PDF to a file. The PDF will have no pages and won't be viewable,
    // but you can look at it in a text editor to see the resulting structure of the PDF.

    // Create a dictionary off the root where we will hang our name and number trees.
    auto root = qpdf.getRoot();
    auto example = QPDFObjectHandle::newDictionary();
    root.replaceKey("/Example", example);

    // Create a name tree, attach it to the file, and add some items.
    auto name_tree = QPDFNameTreeObjectHelper::newEmpty(qpdf);
    auto name_tree_oh = name_tree.getObjectHandle();
    example.replaceKey("/NameTree", name_tree_oh);
    name_tree.insert("K", QPDFObjectHandle::newUnicodeString("king"));
    name_tree.insert("Q", QPDFObjectHandle::newUnicodeString("queen"));
    name_tree.insert("R", QPDFObjectHandle::newUnicodeString("rook"));
    name_tree.insert("B", QPDFObjectHandle::newUnicodeString("bishop"));
    name_tree.insert("N", QPDFObjectHandle::newUnicodeString("knight"));
    auto iter = name_tree.insert("P", QPDFObjectHandle::newUnicodeString("pawn"));
    // Look at the iterator
    std::cout << "just inserted " << iter->first << " -> " << iter->second.unparse() << std::endl;
    --iter;
    std::cout << "predecessor: " << iter->first << " -> " << iter->second.unparse() << std::endl;
    ++iter;
    ++iter;
    std::cout << "successor: " << iter->first << " -> " << iter->second.unparse() << std::endl;

    // Use range-for iteration
    std::cout << "Name tree items:" << std::endl;
    for (auto i: name_tree) {
        std::cout << "  " << i.first << " -> " << i.second.unparse() << std::endl;
    }

    // This is a small tree, so everything will be at the root. We can look at it using dictionary
    // and array iterators.
    std::cout << "Keys in name tree object:" << std::endl;
    QPDFObjectHandle names;
    for (auto const& i: name_tree_oh.ditems()) {
        std::cout << i.first << std::endl;
        if (i.first == "/Names") {
            names = i.second;
        }
    }
    // Values in names array:
    std::cout << "Values in names:" << std::endl;
    for (auto& i: names.aitems()) {
        std::cout << "  " << i.unparse() << std::endl;
    }

    // pre 10.2 API
    std::cout << "Has Q?: " << name_tree.hasName("Q") << std::endl;
    std::cout << "Has W?: " << name_tree.hasName("W") << std::endl;
    QPDFObjectHandle obj;
    std::cout << "Found W?: " << name_tree.findObject("W", obj) << std::endl;
    std::cout << "Found Q?: " << name_tree.findObject("Q", obj) << std::endl;
    std::cout << "Q: " << obj.unparse() << std::endl;

    // 10.2 API
    iter = name_tree.find("Q");
    std::cout << "Q: " << iter->first << " -> " << iter->second.unparse() << std::endl;
    iter = name_tree.find("W");
    std::cout << "W found: " << (iter != name_tree.end()) << std::endl;
    // Allow find to return predecessor
    iter = name_tree.find("W", true);
    std::cout << "W's predecessor: " << iter->first << " -> " << iter->second.unparse()
              << std::endl;

    // We can also remove items
    std::cout << "Remove P: " << name_tree.remove("P", &obj) << std::endl;
    std::cout << "Value removed: " << obj.unparse() << std::endl;
    std::cout << "Has P?: " << name_tree.hasName("P") << std::endl;
    // Or we can remove using an iterator
    iter = name_tree.find("K");
    std::cout << "Find K: " << iter->second.unparse() << std::endl;
    iter.remove();
    std::cout << "Iter after removing K: " << iter->first << " -> " << iter->second.unparse()
              << std::endl;
    std::cout << "Has K?: " << name_tree.hasName("K") << std::endl;

    // Illustrate some more advanced usage using number trees. These calls work for name trees too.

    // The safe way to populate a tree is to call insert repeatedly as above, but if you know you
    // are definitely inserting items in order, it is more efficient to insert them using
    // insertAfter, which avoids doing a binary search through the tree for each insertion. Note
    // that if you don't insert items in order using this method, you will create an invalid tree.
    auto number_tree = QPDFNumberTreeObjectHelper::newEmpty(qpdf);
    auto number_tree_oh = number_tree.getObjectHandle();
    example.replaceKey("/NumberTree", number_tree_oh);
    auto iter2 = number_tree.begin();
    for (int i = 7; i <= 350; i += 7) {
        iter2.insertAfter(i, QPDFObjectHandle::newString("-" + std::to_string(i) + "-"));
    }
    std::cout << "Numbers:" << std::endl;
    int n = 1;
    for (auto& i: number_tree) {
        std::cout << i.first << " -> " << i.second.getUTF8Value();
        if (n % 5) {
            std::cout << ", ";
        } else {
            std::cout << std::endl;
        }
        ++n;
    }

    // When you remove an item with an iterator, the iterator advances. This makes it possible to
    // filter while iterating. Remove all items that are multiples of 5.
    iter2 = number_tree.begin();
    while (iter2 != number_tree.end()) {
        if (iter2->first % 5 == 0) {
            iter2.remove(); // also advances
        } else {
            ++iter2;
        }
    }
    std::cout << "Numbers after filtering:" << std::endl;
    n = 1;
    for (auto& i: number_tree) {
        std::cout << i.first << " -> " << i.second.getUTF8Value();
        if (n % 5) {
            std::cout << ", ";
        } else {
            std::cout << std::endl;
        }
        ++n;
    }

    // Write to an output file
    QPDFWriter w(qpdf, outfilename);
    w.setQDFMode(true);
    w.setStaticID(true); // for testing only
    w.write();

    return 0;
}